

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,OPJ_UINT32 prec)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  
  OVar1 = tccp->numresolutions;
  uVar6 = OVar1 * 3 - 2;
  if (uVar6 != 0) {
    OVar2 = tccp->qmfbid;
    OVar3 = tccp->qntsty;
    uVar11 = 0;
    do {
      uVar7 = 0;
      if (uVar11 == 0) {
        uVar8 = 0;
      }
      else {
        uVar7 = ~(((int)uVar11 - 1U) / 3);
        uVar8 = ((int)uVar11 - 1U) % 3 + 1;
      }
      iVar5 = 2 - (uint)(uVar8 - 1 < 2);
      if (uVar8 == 0) {
        iVar5 = 0;
      }
      if (OVar2 == 0) {
        iVar5 = 0;
      }
      dVar12 = 8192.0;
      if (OVar3 != 0) {
        dVar12 = ((double)(1 << ((byte)iVar5 & 0x1f)) /
                 (double)opj_dwt_norms_real[uVar8][uVar7 + (OVar1 - 1)]) * 8192.0;
      }
      dVar12 = floor(dVar12);
      uVar7 = (uint)dVar12;
      iVar10 = 0;
      iVar9 = 0;
      if (1 < (int)uVar7) {
        iVar9 = 0;
        uVar8 = uVar7;
        do {
          iVar9 = iVar9 + -1;
          bVar4 = 3 < uVar8;
          uVar8 = uVar8 >> 1;
        } while (bVar4);
      }
      if (1 < (int)uVar7) {
        iVar10 = 0;
        uVar8 = uVar7;
        do {
          iVar10 = iVar10 + 1;
          bVar4 = 3 < uVar8;
          uVar8 = uVar8 >> 1;
        } while (bVar4);
      }
      uVar8 = uVar7 << (0xbU - (char)iVar10 & 0x1f);
      if (0xb < iVar10) {
        uVar8 = (int)uVar7 >> ((char)iVar10 - 0xbU & 0x1f);
      }
      tccp->stepsizes[uVar11].mant = uVar8 & 0x7ff;
      tccp->stepsizes[uVar11].expn = iVar5 + prec + 0xd + iVar9;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar6);
  }
  return;
}

Assistant:

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, OPJ_UINT32 prec)
{
    OPJ_UINT32 numbands, bandno;
    numbands = 3 * tccp->numresolutions - 2;
    for (bandno = 0; bandno < numbands; bandno++) {
        OPJ_FLOAT64 stepsize;
        OPJ_UINT32 resno, level, orient, gain;

        resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
        orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
        level = tccp->numresolutions - 1 - resno;
        gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) ||
                                          (orient == 2)) ? 1 : 2));
        if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
            stepsize = 1.0;
        } else {
            OPJ_FLOAT64 norm = opj_dwt_norms_real[orient][level];
            stepsize = (1 << (gain)) / norm;
        }
        opj_dwt_encode_stepsize((OPJ_INT32) floor(stepsize * 8192.0),
                                (OPJ_INT32)(prec + gain), &tccp->stepsizes[bandno]);
    }
}